

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int yy_pop_parser_stack(yyParser *pParser)

{
  int extraout_EAX;
  int iVar1;
  long lVar2;
  
  iVar1 = pParser->yyidx;
  lVar2 = (long)iVar1;
  if (-1 < lVar2) {
    yy_destructor(pParser,pParser->yystack[lVar2].major,&pParser->yystack[lVar2].minor);
    pParser->yyidx = pParser->yyidx + -1;
    iVar1 = extraout_EAX;
  }
  return iVar1;
}

Assistant:

static int yy_pop_parser_stack(yyParser *pParser){
  YYCODETYPE yymajor;
  yyStackEntry *yytos = &pParser->yystack[pParser->yyidx];

  /* There is no mechanism by which the parser stack can be popped below
  ** empty in SQLite.  */
  if( NEVER(pParser->yyidx<0) ) return 0;
#ifndef NDEBUG
  if( yyTraceFILE && pParser->yyidx>=0 ){
    fprintf(yyTraceFILE,"%sPopping %s\n",
      yyTracePrompt,
      yyTokenName[yytos->major]);
  }
#endif
  yymajor = yytos->major;
  yy_destructor(pParser, yymajor, &yytos->minor);
  pParser->yyidx--;
  return yymajor;
}